

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O3

void ts_subtree_retain(Subtree self)

{
  if (((ulong)self.ptr & 1) == 0) {
    if ((self.ptr)->ref_count == 0) {
      __assert_fail("self.ptr->ref_count > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/subtree.c"
                    ,0x1fd,"void ts_subtree_retain(Subtree)");
    }
    LOCK();
    (self.ptr)->ref_count = (self.ptr)->ref_count + 1;
    UNLOCK();
    if ((self.ptr)->ref_count == 0) {
      __assert_fail("self.ptr->ref_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/subtree.c"
                    ,0x1ff,"void ts_subtree_retain(Subtree)");
    }
  }
  return;
}

Assistant:

void ts_subtree_retain(Subtree self) {
  if (self.data.is_inline) return;
  assert(self.ptr->ref_count > 0);
  atomic_inc((volatile uint32_t *)&self.ptr->ref_count);
  assert(self.ptr->ref_count != 0);
}